

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O2

int __thiscall
duckdb_re2::Regexp::Walker<int>::WalkInternal
          (Walker<int> *this,Regexp *re,int top_arg,bool use_copy)

{
  stack<duckdb_re2::WalkState<int>,_std::deque<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>_>
  *this_00;
  ushort uVar1;
  int iVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  _Elt_pointer pWVar4;
  int *piVar5;
  Regexp *pRVar6;
  ulong uVar7;
  bool stop;
  undefined1 local_1b0 [8];
  int local_1a8;
  int local_1a4;
  int *local_198;
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,"Walk NULL");
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  }
  else {
    this_00 = &this->stack_;
    local_1a8 = -1;
    local_198 = (int *)0x0;
    local_1b0 = (undefined1  [8])re;
    local_1a4 = top_arg;
    std::deque<duckdb_re2::WalkState<int>,std::allocator<duckdb_re2::WalkState<int>>>::
    emplace_back<duckdb_re2::WalkState<int>>
              ((deque<duckdb_re2::WalkState<int>,std::allocator<duckdb_re2::WalkState<int>>> *)
               this_00,(WalkState<int> *)local_1b0);
LAB_00ea3c48:
    while( true ) {
      pWVar4 = (this->stack_).c.
               super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar4 == (this->stack_).c.
                    super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar4 = (this->stack_).c.
                 super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      pRVar6 = pWVar4[-1].re;
      uVar7 = (ulong)(uint)pWVar4[-1].n;
      if (pWVar4[-1].n == 0xffffffff) break;
LAB_00ea3c6d:
      uVar1 = pRVar6->nsub_;
      if (uVar1 == 0) {
LAB_00ea3d4b:
        top_arg = (*this->_vptr_Walker[3])
                            (this,pRVar6,(ulong)(uint)pWVar4[-1].parent_arg,
                             (ulong)(uint)pWVar4[-1].pre_arg,pWVar4[-1].child_args);
        if ((1 < pRVar6->nsub_) && (pWVar4[-1].child_args != (int *)0x0)) {
          operator_delete__(pWVar4[-1].child_args);
        }
        goto LAB_00ea3d99;
      }
      if (uVar1 == 1) {
        paVar3 = &pRVar6->field_5;
      }
      else {
        paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar6->field_5).submany_;
      }
      iVar2 = (int)uVar7;
      if ((int)(uint)uVar1 <= iVar2) goto LAB_00ea3d4b;
      if (use_copy && 0 < iVar2) {
        pRVar6 = (Regexp *)paVar3[uVar7].submany_;
        if ((Regexp *)paVar3[iVar2 - 1U].submany_ != pRVar6) goto LAB_00ea3de8;
        iVar2 = (*this->_vptr_Walker[4])(this,(ulong)(uint)pWVar4[-1].child_args[iVar2 - 1U]);
        pWVar4[-1].child_args[pWVar4[-1].n] = iVar2;
        pWVar4[-1].n = pWVar4[-1].n + 1;
      }
      else {
        pRVar6 = (Regexp *)paVar3[iVar2].submany_;
LAB_00ea3de8:
        local_1a4 = pWVar4[-1].pre_arg;
        local_1a8 = -1;
        local_198 = (int *)0x0;
        local_1b0 = (undefined1  [8])pRVar6;
        std::deque<duckdb_re2::WalkState<int>,std::allocator<duckdb_re2::WalkState<int>>>::
        emplace_back<duckdb_re2::WalkState<int>>
                  ((deque<duckdb_re2::WalkState<int>,std::allocator<duckdb_re2::WalkState<int>>> *)
                   this_00,(WalkState<int> *)local_1b0);
      }
    }
    iVar2 = this->max_visits_;
    this->max_visits_ = iVar2 + -1;
    if (iVar2 < 1) {
      this->stopped_early_ = true;
      top_arg = (*this->_vptr_Walker[5])(this,pRVar6,(ulong)(uint)pWVar4[-1].parent_arg);
    }
    else {
      local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
      top_arg = (*this->_vptr_Walker[2])(this,pRVar6,(ulong)(uint)pWVar4[-1].parent_arg,local_1b0);
      pWVar4[-1].pre_arg = top_arg;
      if (local_1b0[0] == '\0') {
        pWVar4[-1].n = 0;
        pWVar4[-1].child_args = (int *)0x0;
        uVar1 = pRVar6->nsub_;
        uVar7 = (ulong)uVar1;
        if (uVar1 != 0) {
          if (uVar1 == 1) {
            pWVar4[-1].child_args = &pWVar4[-1].child_arg;
            uVar7 = 0;
          }
          else {
            piVar5 = (int *)operator_new__((ulong)uVar1 << 2);
            pWVar4[-1].child_args = piVar5;
            uVar7 = (ulong)(uint)pWVar4[-1].n;
          }
        }
        goto LAB_00ea3c6d;
      }
    }
LAB_00ea3d99:
    std::deque<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>::pop_back
              (&this_00->c);
    pWVar4 = (this->stack_).c.
             super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pWVar4 != (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pWVar4 == (this->stack_).c.
                    super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar4 = (this->stack_).c.
                 super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      if (pWVar4[-1].child_args == (int *)0x0) {
        piVar5 = &pWVar4[-1].child_arg;
      }
      else {
        piVar5 = pWVar4[-1].child_args + pWVar4[-1].n;
      }
      *piVar5 = top_arg;
      pWVar4[-1].n = pWVar4[-1].n + 1;
      goto LAB_00ea3c48;
    }
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}